

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O1

QThemeIconInfo * __thiscall
QIconLoader::lookupFallbackIcon
          (QThemeIconInfo *__return_storage_ptr__,QIconLoader *this,QString *iconName)

{
  QArrayData *pQVar1;
  qsizetype qVar2;
  int *piVar3;
  _func_int ***ppp_Var4;
  char cVar5;
  _Head_base<0UL,_QIconLoaderEngineEntry_*,_false> _Var6;
  char16_t *pcVar7;
  QString *pQVar8;
  long lVar9;
  long in_FS_OFFSET;
  QByteArrayView QVar10;
  unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_> iconEntry;
  QDir currentDir;
  QString local_e0;
  _Head_base<0UL,_QIconLoaderEngineEntry_*,_false> local_c8;
  undefined1 *local_c0;
  QArrayDataPointer<QString> local_b8;
  QStringBuilder<const_QString_&,_QLatin1String> local_98;
  QString local_78;
  char *local_60;
  QStringBuilder<const_QString_&,_QLatin1String> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lcIconLoader();
  if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_78.d.d._0_4_ = 2;
    local_78.d.d._4_4_ = 0;
    local_78.d.ptr._0_4_ = 0;
    local_78.d.ptr._4_4_ = 0;
    local_78.d.size._0_4_ = 0;
    local_78.d.size._4_4_ = 0;
    local_60 = lcIconLoader::category.name;
    QMessageLogger::debug();
    pQVar8 = local_98.a;
    QVar10.m_data = (storage_type *)0x18;
    QVar10.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar10);
    QTextStream::operator<<((QTextStream *)pQVar8,(QString *)&local_58);
    if ((QArrayData *)local_58.a != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&(local_58.a)->d)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)&(local_58.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)&(local_58.a)->d)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_58.a,2,0x10);
      }
    }
    if (*(QTextStream *)((long)local_98.a + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_98.a,' ');
    }
    pcVar7 = (iconName->d).ptr;
    if (pcVar7 == (char16_t *)0x0) {
      pcVar7 = (char16_t *)&QString::_empty;
    }
    QDebug::putString((QChar *)&local_98,(ulong)pcVar7);
    if (*(QTextStream *)((long)local_98.a + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_98.a,' ');
    }
    QDebug::~QDebug((QDebug *)&local_98);
  }
  (__return_storage_ptr__->iconName).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->iconName).d.size = 0;
  (__return_storage_ptr__->entries).
  super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->iconName).d.d = (Data *)0x0;
  (__return_storage_ptr__->entries).
  super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->entries).
  super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.d.size._0_4_ = 0xaaaaaaaa;
  local_78.d.size._4_4_ = 0xaaaaaaaa;
  local_78.d.d._0_4_ = 0xaaaaaaaa;
  local_78.d.d._4_4_ = 0xaaaaaaaa;
  local_78.d.ptr._0_4_ = 0xaaaaaaaa;
  local_78.d.ptr._4_4_ = 0xaaaaaaaa;
  local_58.b.m_size = 4;
  local_58.b.m_data = ".png";
  local_58.a = iconName;
  QStringBuilder<const_QString_&,_QLatin1String>::convertTo<QString>(&local_78,&local_58);
  local_58.b.m_data = &DAT_aaaaaaaaaaaaaaaa;
  local_58.a = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.b.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.b.m_size = 4;
  local_98.b.m_data = ".xpm";
  local_98.a = iconName;
  QStringBuilder<const_QString_&,_QLatin1String>::convertTo<QString>((QString *)&local_58,&local_98)
  ;
  local_98.b.m_data = &DAT_aaaaaaaaaaaaaaaa;
  local_98.a = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.b.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.ptr = (QString *)0x4;
  local_b8.size = 0x685aee;
  local_b8.d = (Data *)iconName;
  QStringBuilder<const_QString_&,_QLatin1String>::convertTo<QString>
            ((QString *)&local_98,(QStringBuilder<const_QString_&,_QLatin1String> *)&local_b8);
  local_b8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QIcon::fallbackSearchPaths();
  if ((undefined1 *)local_b8.size != (undefined1 *)0x0) {
    lVar9 = local_b8.size * 0x18;
    pQVar8 = local_b8.ptr;
    do {
      local_c0 = &DAT_aaaaaaaaaaaaaaaa;
      QDir::QDir((QDir *)&local_c0,pQVar8);
      local_c8._M_head_impl = (QIconLoaderEngineEntry *)0x0;
      cVar5 = QDir::exists((QString *)&local_c0);
      if (cVar5 == '\0') {
        cVar5 = QDir::exists((QString *)&local_c0);
        if (cVar5 != '\0') {
          _Var6._M_head_impl = (QIconLoaderEngineEntry *)operator_new(0x60);
          ((_Var6._M_head_impl)->dir).path.d.size = 0;
          ((_Var6._M_head_impl)->dir).size = 0;
          ((_Var6._M_head_impl)->dir).maxSize = 0;
          ((_Var6._M_head_impl)->dir).minSize = 0;
          ((_Var6._M_head_impl)->dir).threshold = 0;
          ((_Var6._M_head_impl)->dir).path.d.d = (Data *)0x0;
          ((_Var6._M_head_impl)->dir).path.d.ptr = (char16_t *)0x0;
          ((_Var6._M_head_impl)->filename).d.ptr = (char16_t *)0x0;
          ((_Var6._M_head_impl)->filename).d.size = 0;
          (_Var6._M_head_impl)->_vptr_QIconLoaderEngineEntry = (_func_int **)0x0;
          ((_Var6._M_head_impl)->filename).d.d = (Data *)0x0;
          ((_Var6._M_head_impl)->dir).scale = 0;
          ((_Var6._M_head_impl)->dir).type = Fixed;
          ((_Var6._M_head_impl)->dir).context = UnknownContext;
          *(undefined4 *)&((_Var6._M_head_impl)->dir).field_0x24 = 0;
          _Var6._M_head_impl[1]._vptr_QIconLoaderEngineEntry = (_func_int **)0x0;
          _Var6._M_head_impl[1].filename.d.d = (Data *)0x0;
          _Var6._M_head_impl[1].filename.d.ptr = (char16_t *)0x0;
          ((_Var6._M_head_impl)->dir).path.d.ptr = (char16_t *)0x0;
          ((_Var6._M_head_impl)->dir).path.d.size = 0;
          ((_Var6._M_head_impl)->filename).d.size = 0;
          ((_Var6._M_head_impl)->dir).path.d.d = (Data *)0x0;
          ((_Var6._M_head_impl)->filename).d.d = (Data *)0x0;
          ((_Var6._M_head_impl)->filename).d.ptr = (char16_t *)0x0;
          ((_Var6._M_head_impl)->dir).size = 0;
          ((_Var6._M_head_impl)->dir).maxSize = 0;
          ((_Var6._M_head_impl)->dir).minSize = 0;
          ((_Var6._M_head_impl)->dir).threshold = 0;
          ((_Var6._M_head_impl)->dir).scale = 1;
          ((_Var6._M_head_impl)->dir).type = Threshold;
          ((_Var6._M_head_impl)->dir).context = UnknownContext;
          (_Var6._M_head_impl)->_vptr_QIconLoaderEngineEntry =
               (_func_int **)&PTR__PixmapEntry_007e2e80;
          QPixmap::QPixmap((QPixmap *)(_Var6._M_head_impl + 1));
          if (local_c8._M_head_impl != (QIconLoaderEngineEntry *)0x0) {
            ppp_Var4 = &(local_c8._M_head_impl)->_vptr_QIconLoaderEngineEntry;
            local_c8._M_head_impl = _Var6._M_head_impl;
            (*(*ppp_Var4)[1])();
            _Var6._M_head_impl = local_c8._M_head_impl;
          }
          local_c8._M_head_impl = _Var6._M_head_impl;
          ((local_c8._M_head_impl)->dir).type = Fallback;
          goto LAB_0027c910;
        }
        if ((this->m_supportsSvg == true) &&
           (cVar5 = QDir::exists((QString *)&local_c0), cVar5 != '\0')) {
          _Var6._M_head_impl = (QIconLoaderEngineEntry *)operator_new(0x50);
          ((_Var6._M_head_impl)->dir).path.d.size = 0;
          ((_Var6._M_head_impl)->dir).size = 0;
          ((_Var6._M_head_impl)->dir).maxSize = 0;
          ((_Var6._M_head_impl)->dir).minSize = 0;
          ((_Var6._M_head_impl)->dir).threshold = 0;
          ((_Var6._M_head_impl)->dir).path.d.d = (Data *)0x0;
          ((_Var6._M_head_impl)->dir).path.d.ptr = (char16_t *)0x0;
          ((_Var6._M_head_impl)->filename).d.ptr = (char16_t *)0x0;
          ((_Var6._M_head_impl)->filename).d.size = 0;
          (_Var6._M_head_impl)->_vptr_QIconLoaderEngineEntry = (_func_int **)0x0;
          ((_Var6._M_head_impl)->filename).d.d = (Data *)0x0;
          ((_Var6._M_head_impl)->dir).scale = 0;
          ((_Var6._M_head_impl)->dir).type = Fixed;
          ((_Var6._M_head_impl)->dir).context = UnknownContext;
          *(undefined4 *)&((_Var6._M_head_impl)->dir).field_0x24 = 0;
          _Var6._M_head_impl[1]._vptr_QIconLoaderEngineEntry = (_func_int **)0x0;
          ((_Var6._M_head_impl)->dir).path.d.ptr = (char16_t *)0x0;
          ((_Var6._M_head_impl)->dir).path.d.size = 0;
          ((_Var6._M_head_impl)->filename).d.size = 0;
          ((_Var6._M_head_impl)->dir).path.d.d = (Data *)0x0;
          ((_Var6._M_head_impl)->filename).d.d = (Data *)0x0;
          ((_Var6._M_head_impl)->filename).d.ptr = (char16_t *)0x0;
          ((_Var6._M_head_impl)->dir).size = 0;
          ((_Var6._M_head_impl)->dir).maxSize = 0;
          ((_Var6._M_head_impl)->dir).minSize = 0;
          ((_Var6._M_head_impl)->dir).threshold = 0;
          ((_Var6._M_head_impl)->dir).scale = 1;
          ((_Var6._M_head_impl)->dir).type = Threshold;
          ((_Var6._M_head_impl)->dir).context = UnknownContext;
          (_Var6._M_head_impl)->_vptr_QIconLoaderEngineEntry =
               (_func_int **)&PTR__ScalableEntry_007e2ec0;
          QIcon::QIcon((QIcon *)(_Var6._M_head_impl + 1));
          if (local_c8._M_head_impl != (QIconLoaderEngineEntry *)0x0) {
            ppp_Var4 = &(local_c8._M_head_impl)->_vptr_QIconLoaderEngineEntry;
            local_c8._M_head_impl = _Var6._M_head_impl;
            (*(*ppp_Var4)[1])();
            _Var6._M_head_impl = local_c8._M_head_impl;
          }
          local_c8._M_head_impl = _Var6._M_head_impl;
          ((local_c8._M_head_impl)->dir).type = Fallback;
          goto LAB_0027c910;
        }
      }
      else {
        _Var6._M_head_impl = (QIconLoaderEngineEntry *)operator_new(0x60);
        ((_Var6._M_head_impl)->dir).path.d.size = 0;
        ((_Var6._M_head_impl)->dir).size = 0;
        ((_Var6._M_head_impl)->dir).maxSize = 0;
        ((_Var6._M_head_impl)->dir).minSize = 0;
        ((_Var6._M_head_impl)->dir).threshold = 0;
        ((_Var6._M_head_impl)->dir).path.d.d = (Data *)0x0;
        ((_Var6._M_head_impl)->dir).path.d.ptr = (char16_t *)0x0;
        ((_Var6._M_head_impl)->filename).d.ptr = (char16_t *)0x0;
        ((_Var6._M_head_impl)->filename).d.size = 0;
        (_Var6._M_head_impl)->_vptr_QIconLoaderEngineEntry = (_func_int **)0x0;
        ((_Var6._M_head_impl)->filename).d.d = (Data *)0x0;
        ((_Var6._M_head_impl)->dir).scale = 0;
        ((_Var6._M_head_impl)->dir).type = Fixed;
        ((_Var6._M_head_impl)->dir).context = UnknownContext;
        *(undefined4 *)&((_Var6._M_head_impl)->dir).field_0x24 = 0;
        _Var6._M_head_impl[1]._vptr_QIconLoaderEngineEntry = (_func_int **)0x0;
        _Var6._M_head_impl[1].filename.d.d = (Data *)0x0;
        _Var6._M_head_impl[1].filename.d.ptr = (char16_t *)0x0;
        ((_Var6._M_head_impl)->dir).path.d.ptr = (char16_t *)0x0;
        ((_Var6._M_head_impl)->dir).path.d.size = 0;
        ((_Var6._M_head_impl)->filename).d.size = 0;
        ((_Var6._M_head_impl)->dir).path.d.d = (Data *)0x0;
        ((_Var6._M_head_impl)->filename).d.d = (Data *)0x0;
        ((_Var6._M_head_impl)->filename).d.ptr = (char16_t *)0x0;
        ((_Var6._M_head_impl)->dir).size = 0;
        ((_Var6._M_head_impl)->dir).maxSize = 0;
        ((_Var6._M_head_impl)->dir).minSize = 0;
        ((_Var6._M_head_impl)->dir).threshold = 0;
        ((_Var6._M_head_impl)->dir).scale = 1;
        ((_Var6._M_head_impl)->dir).type = Threshold;
        ((_Var6._M_head_impl)->dir).context = UnknownContext;
        (_Var6._M_head_impl)->_vptr_QIconLoaderEngineEntry =
             (_func_int **)&PTR__PixmapEntry_007e2e80;
        QPixmap::QPixmap((QPixmap *)(_Var6._M_head_impl + 1));
        if (local_c8._M_head_impl != (QIconLoaderEngineEntry *)0x0) {
          ppp_Var4 = &(local_c8._M_head_impl)->_vptr_QIconLoaderEngineEntry;
          local_c8._M_head_impl = _Var6._M_head_impl;
          (*(*ppp_Var4)[1])();
          _Var6._M_head_impl = local_c8._M_head_impl;
        }
        local_c8._M_head_impl = _Var6._M_head_impl;
        ((local_c8._M_head_impl)->dir).type = Fallback;
LAB_0027c910:
        QDir::filePath(&local_e0);
        pQVar1 = &(((local_c8._M_head_impl)->filename).d.d)->super_QArrayData;
        ((local_c8._M_head_impl)->filename).d.d = local_e0.d.d;
        pcVar7 = ((local_c8._M_head_impl)->filename).d.ptr;
        ((local_c8._M_head_impl)->filename).d.ptr = local_e0.d.ptr;
        qVar2 = ((local_c8._M_head_impl)->filename).d.size;
        ((local_c8._M_head_impl)->filename).d.size = local_e0.d.size;
        local_e0.d.d = (Data *)pQVar1;
        local_e0.d.ptr = pcVar7;
        local_e0.d.size = qVar2;
        if (pQVar1 != (QArrayData *)0x0) {
          LOCK();
          (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar1,2,0x10);
          }
        }
      }
      if (local_c8._M_head_impl != (QIconLoaderEngineEntry *)0x0) {
        std::
        vector<std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>,std::allocator<std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>>>
        ::
        emplace_back<std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>>
                  ((vector<std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>,std::allocator<std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>>>
                    *)__return_storage_ptr__,
                   (unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                    *)&local_c8);
        if (local_c8._M_head_impl != (QIconLoaderEngineEntry *)0x0) {
          (*(local_c8._M_head_impl)->_vptr_QIconLoaderEngineEntry[1])();
        }
        QDir::~QDir((QDir *)&local_c0);
        break;
      }
      QDir::~QDir((QDir *)&local_c0);
      pQVar8 = pQVar8 + 1;
      lVar9 = lVar9 + -0x18;
    } while (lVar9 != 0);
  }
  if ((__return_storage_ptr__->entries).
      super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (__return_storage_ptr__->entries).
      super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    QString::operator=(&__return_storage_ptr__->iconName,iconName);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_b8);
  if ((QArrayData *)local_98.a != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_98.a)->d)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)&(local_98.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_98.a)->d)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_98.a,2,0x10);
    }
  }
  if ((QArrayData *)local_58.a != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_58.a)->d)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)&(local_58.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_58.a)->d)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_58.a,2,0x10);
    }
  }
  piVar3 = (int *)CONCAT44(local_78.d.d._4_4_,local_78.d.d._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_78.d.d._4_4_,local_78.d.d._0_4_),2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QThemeIconInfo QIconLoader::lookupFallbackIcon(const QString &iconName) const
{
    qCDebug(lcIconLoader) << "Looking up fallback icon" << iconName;

    QThemeIconInfo info;

    const QString pngIconName = iconName + ".png"_L1;
    const QString xpmIconName = iconName + ".xpm"_L1;
    const QString svgIconName = iconName + ".svg"_L1;

    const auto searchPaths = QIcon::fallbackSearchPaths();
    for (const QString &iconDir: searchPaths) {
        QDir currentDir(iconDir);
        std::unique_ptr<QIconLoaderEngineEntry> iconEntry;
        if (currentDir.exists(pngIconName)) {
            iconEntry = std::make_unique<PixmapEntry>();
            iconEntry->dir.type = QIconDirInfo::Fallback;
            iconEntry->filename = currentDir.filePath(pngIconName);
        } else if (currentDir.exists(xpmIconName)) {
            iconEntry = std::make_unique<PixmapEntry>();
            iconEntry->dir.type = QIconDirInfo::Fallback;
            iconEntry->filename = currentDir.filePath(xpmIconName);
        } else if (m_supportsSvg &&
                   currentDir.exists(svgIconName)) {
            iconEntry = std::make_unique<ScalableEntry>();
            iconEntry->dir.type = QIconDirInfo::Fallback;
            iconEntry->filename = currentDir.filePath(svgIconName);
        }
        if (iconEntry) {
            info.entries.push_back(std::move(iconEntry));
            break;
        }
    }

    if (!info.entries.empty())
        info.iconName = iconName;

    return info;
}